

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall smf::Options::appendOptions(Options *this,int argc,char **argv)

{
  char *__s;
  pointer pbVar1;
  char *pcVar2;
  int iVar3;
  size_type __new_size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar4;
  long lVar5;
  
  this->m_processedQ = 0;
  this_00 = &this->m_extraArgv;
  iVar3 = (int)((ulong)((long)(this->m_extraArgv).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_extraArgv).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
  __new_size = (size_type)(iVar3 + argc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(this_00,__new_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv_strings,__new_size);
  if (0 < argc) {
    lVar5 = (long)iVar3 << 5;
    uVar4 = 0;
    do {
      __s = argv[uVar4];
      pbVar1 = (this->m_extraArgv_strings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = *(char **)((long)&pbVar1->_M_string_length + lVar5);
      strlen(__s);
      std::__cxx11::string::_M_replace
                ((long)&(pbVar1->_M_dataplus)._M_p + lVar5,0,pcVar2,(ulong)__s);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((uint)argc != uVar4);
  }
  this->m_oargc =
       (int)((ulong)((long)(this->m_extraArgv).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_extraArgv).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_oargv,this_00);
  return;
}

Assistant:

void Options::appendOptions(int argc, char** argv) {
   m_processedQ = 0;

   // data used to be stored directly here:
   //gargc = argc;
   //gargv = argv;
   // but now gets interfaced to: m_extraArgv and m_extraArgv_strings:

   int oldsize = (int)m_extraArgv.size();
   m_extraArgv.resize(oldsize + argc);
   m_extraArgv_strings.resize(oldsize + argc);

   int i;
   for (i=0; i<argc; i++) {
      m_extraArgv_strings[i+oldsize] = argv[i];
      m_extraArgv[i+oldsize] = m_extraArgv_strings[i+oldsize];
   }

   m_oargc = (int)m_extraArgv.size();
   m_oargv = m_extraArgv;
}